

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread.c
# Opt level: O2

void evthread_debug_lock_mark_locked(uint mode,debug_lock *lock)

{
  int iVar1;
  unsigned_long uVar2;
  undefined8 uVar3;
  undefined4 in_register_0000003c;
  int *piVar4;
  char *pcVar5;
  
  piVar4 = (int *)CONCAT44(in_register_0000003c,mode);
  if (*piVar4 == -0x214f4ef4) {
    iVar1 = piVar4[4];
    piVar4[4] = iVar1 + 1;
    if (iVar1 == 0 || (*(byte *)(piVar4 + 1) & 1) != 0) {
      if (evthread_id_fn_ != (_func_unsigned_long *)0x0) {
        uVar2 = (*evthread_id_fn_)();
        if ((1 < piVar4[4]) && (*(unsigned_long *)(piVar4 + 2) != uVar2)) {
          pcVar5 = "lock->held_by == me";
          uVar3 = 0xf4;
          goto LAB_00203628;
        }
        *(unsigned_long *)(piVar4 + 2) = uVar2;
      }
      return;
    }
    pcVar5 = "lock->count == 1";
    uVar3 = 0xef;
  }
  else {
    pcVar5 = "DEBUG_LOCK_SIG == lock->signature";
    uVar3 = 0xec;
  }
LAB_00203628:
  event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evthread.c"
             ,uVar3,pcVar5,"evthread_debug_lock_mark_locked");
}

Assistant:

static void
evthread_debug_lock_mark_locked(unsigned mode, struct debug_lock *lock)
{
	EVUTIL_ASSERT(DEBUG_LOCK_SIG == lock->signature);
	++lock->count;
	if (!(lock->locktype & EVTHREAD_LOCKTYPE_RECURSIVE))
		EVUTIL_ASSERT(lock->count == 1);
	if (evthread_id_fn_) {
		unsigned long me;
		me = evthread_id_fn_();
		if (lock->count > 1)
			EVUTIL_ASSERT(lock->held_by == me);
		lock->held_by = me;
	}
}